

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O0

CURLcode setstropt_userpwd(char *option,char **userp,char **passwdp)

{
  CURLcode CVar1;
  size_t len_00;
  CURLcode result;
  size_t len;
  char *passwd;
  char *user;
  char **passwdp_local;
  char **userp_local;
  char *option_local;
  
  passwd = (char *)0x0;
  len = 0;
  user = (char *)passwdp;
  passwdp_local = userp;
  userp_local = (char **)option;
  if (option != (char *)0x0) {
    len_00 = strlen(option);
    if (8000000 < len_00) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    CVar1 = Curl_parse_login_details((char *)userp_local,len_00,&passwd,(char **)&len,(char **)0x0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  (*Curl_cfree)(*passwdp_local);
  *passwdp_local = passwd;
  (*Curl_cfree)(*(void **)user);
  *(size_t *)user = len;
  return CURLE_OK;
}

Assistant:

static CURLcode setstropt_userpwd(char *option, char **userp, char **passwdp)
{
  char *user = NULL;
  char *passwd = NULL;

  DEBUGASSERT(userp);
  DEBUGASSERT(passwdp);

  /* Parse the login details if specified. It not then we treat NULL as a hint
     to clear the existing data */
  if(option) {
    size_t len = strlen(option);
    CURLcode result;
    if(len > CURL_MAX_INPUT_LENGTH)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    result = Curl_parse_login_details(option, len, &user, &passwd, NULL);
    if(result)
      return result;
  }

  free(*userp);
  *userp = user;

  free(*passwdp);
  *passwdp = passwd;

  return CURLE_OK;
}